

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O3

bool __thiscall
CScript::IsWitnessProgram
          (CScript *this,int *version,vector<unsigned_char,_std::allocator<unsigned_char>_> *program
          )

{
  byte bVar1;
  pointer puVar2;
  pointer puVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  CScript *pCVar7;
  int iVar8;
  long in_FS_OFFSET;
  allocator_type local_39;
  pointer local_38;
  pointer puStack_30;
  pointer local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = (this->super_CScriptBase)._size;
  uVar4 = uVar6 - 0x1d;
  if (uVar6 < 0x1d) {
    uVar4 = uVar6;
  }
  if (0xffffffd8 < uVar4 - 0x2b) {
    pCVar7 = this;
    if (0x1c < uVar6) {
      pCVar7 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
    }
    bVar1 = (pCVar7->super_CScriptBase)._union.direct[0];
    if (bVar1 == 0 || 0xef < (byte)(bVar1 + 0x9f)) {
      bVar5 = false;
      iVar8 = 0;
      if ((byte)(pCVar7->super_CScriptBase)._union.direct[1] + 2 == uVar4) {
        if (bVar1 != 0) {
          if (0xf < bVar1 - 0x51) {
            __assert_fail("opcode >= OP_1 && opcode <= OP_16",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/script.h"
                          ,0x1fe,"static int CScript::DecodeOP_N(opcodetype)");
          }
          iVar8 = bVar1 - 0x50;
        }
        *version = iVar8;
        uVar6 = (this->super_CScriptBase)._size;
        if (0x1c < uVar6) {
          this = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
          uVar6 = uVar6 - 0x1d;
        }
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_38,
                   (uchar *)((long)&(this->super_CScriptBase)._union + 2),
                   (uchar *)((long)&(this->super_CScriptBase)._union + (long)(int)uVar6),&local_39);
        puVar2 = (program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        puVar3 = (program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        (program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start = local_38;
        (program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish = puStack_30;
        (program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_28;
        local_38 = (pointer)0x0;
        puStack_30 = (pointer)0x0;
        local_28 = (pointer)0x0;
        if ((puVar2 != (pointer)0x0) &&
           (operator_delete(puVar2,(long)puVar3 - (long)puVar2), local_38 != (pointer)0x0)) {
          operator_delete(local_38,(long)local_28 - (long)local_38);
        }
        bVar5 = true;
      }
      goto LAB_001f385e;
    }
  }
  bVar5 = false;
LAB_001f385e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool CScript::IsWitnessProgram(int& version, std::vector<unsigned char>& program) const
{
    if (this->size() < 4 || this->size() > 42) {
        return false;
    }
    if ((*this)[0] != OP_0 && ((*this)[0] < OP_1 || (*this)[0] > OP_16)) {
        return false;
    }
    if ((size_t)((*this)[1] + 2) == this->size()) {
        version = DecodeOP_N((opcodetype)(*this)[0]);
        program = std::vector<unsigned char>(this->begin() + 2, this->end());
        return true;
    }
    return false;
}